

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directional_light.cpp
# Opt level: O3

Light_SampleRes *
embree::DirectionalLight_sample
          (Light_SampleRes *__return_storage_ptr__,Light *super,DifferentialGeometry *dg,Vec2f *s)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined8 uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  uVar8 = *(undefined8 *)(super + 0xe);
  *(undefined8 *)&(__return_storage_ptr__->dir).field_0 = *(undefined8 *)(super + 0xc);
  *(undefined8 *)((long)&(__return_storage_ptr__->dir).field_0 + 8) = uVar8;
  __return_storage_ptr__->dist = INFINITY;
  __return_storage_ptr__->pdf = (float)super[0x15].type;
  if ((float)super[0x14].type < 0.9999999) {
    fVar13 = (s->field_0).field_0.x * 6.2831855;
    fVar9 = 1.0 - (1.0 - (float)super[0x14].type) * (s->field_0).field_0.y;
    fVar12 = 1.0 - fVar9 * fVar9;
    if (fVar12 <= 0.0) {
      fVar12 = 0.0;
    }
    fVar10 = sinf(fVar13);
    fVar11 = cosf(fVar13);
    fVar11 = fVar11 * SQRT(fVar12);
    fVar10 = fVar10 * SQRT(fVar12);
    fVar12 = (float)super[0xd].type;
    fVar13 = (float)super[0xe].type;
    fVar1 = (float)super[0xf].type;
    fVar2 = (float)super[9].type;
    fVar3 = (float)super[10].type;
    fVar4 = (float)super[0xb].type;
    fVar5 = (float)super[5].type;
    fVar6 = (float)super[6].type;
    fVar7 = (float)super[7].type;
    (__return_storage_ptr__->dir).field_0.m128[0] =
         fVar11 * (float)super[4].type +
         fVar10 * (float)super[8].type + fVar9 * (float)super[0xc].type;
    (__return_storage_ptr__->dir).field_0.m128[1] = fVar11 * fVar5 + fVar10 * fVar2 + fVar9 * fVar12
    ;
    (__return_storage_ptr__->dir).field_0.m128[2] = fVar11 * fVar6 + fVar10 * fVar3 + fVar9 * fVar13
    ;
    (__return_storage_ptr__->dir).field_0.m128[3] = fVar11 * fVar7 + fVar10 * fVar4 + fVar9 * fVar1;
  }
  uVar8 = *(undefined8 *)(super + 0x12);
  *(undefined8 *)&(__return_storage_ptr__->weight).field_0 = *(undefined8 *)(super + 0x10);
  *(undefined8 *)((long)&(__return_storage_ptr__->weight).field_0 + 8) = uVar8;
  return __return_storage_ptr__;
}

Assistant:

SYCL_EXTERNAL Light_SampleRes DirectionalLight_sample(const Light* super,
                                                                     const DifferentialGeometry& dg,
                                                                     const Vec2f& s)
{
  const DirectionalLight* self = (DirectionalLight*)super;
  Light_SampleRes res;

  res.dir = self->frame.vz;
  res.dist = inf;
  res.pdf = self->pdf;

  if (self->cosAngle < COS_ANGLE_MAX)
    res.dir = self->frame * uniformSampleCone(self->cosAngle, s);

  res.weight = self->radiance; // *pdf/pdf cancel

  return res;
}